

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<std::complex<double>,_1000>::~TPZManVector
          (TPZManVector<std::complex<double>,_1000> *this)

{
  ~TPZManVector(this);
  operator_delete(this,0x3ea0);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}